

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::attrItemStruct(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *nodes;
  uint uVar1;
  int iVar2;
  int *piVar3;
  undefined8 *puVar4;
  AST *pAVar5;
  NoViableAltException *pNVar6;
  AST *pAVar7;
  bool bVar8;
  RefAST tmp111_AST;
  RefAST attrItemStruct_AST;
  RefAST X_AST;
  RefAST I_AST;
  ASTPair currentAST;
  RefAST tmp109_AST;
  undefined1 local_c0 [16];
  RefCount<AST> local_b0;
  RefCount<AST> local_a8;
  RefCount<AST> local_a0;
  ASTPair local_98;
  RefCount<AST> local_80;
  ASTFactory local_78;
  RefCount<Token> local_68;
  RefCount<Token> local_60;
  RefCount<AST> local_58;
  RefCount<AST> local_50;
  RefCount<AST> local_48;
  RefToken local_40;
  RefToken local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_b0.ref = nullAST.ref;
  local_98.root.ref = (Ref *)0x0;
  local_98.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_b0.ref = (Ref *)0x0;
  }
  else {
    uVar1 = (nullAST.ref)->count;
    (nullAST.ref)->count = uVar1 + 1;
    (local_b0.ref)->count = uVar1 + 2;
    (local_b0.ref)->count = (local_b0.ref)->count + 1;
  }
  local_a8.ref = local_b0.ref;
  local_a0.ref = local_b0.ref;
  attrName(this);
  RefCount<AST>::operator=(&local_a0,this_00);
  local_58.ref = nullAST.ref;
  if (nullAST.ref == (Ref *)0x0) {
    local_58.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
  nodes = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)(local_c0 + 8),(RefToken *)nodes);
  RefCount<AST>::operator=(&local_58,(RefCount<AST> *)(local_c0 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_c0 + 8));
  RefCount<Token>::~RefCount(&local_60);
  Parser::match((Parser *)this,0xb);
  uVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  switch(uVar1) {
  case 8:
  case 0xc:
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x10:
switchD_00199856_caseD_9:
    pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_38,this,1);
    NoViableAltException::NoViableAltException(pNVar6,&local_38);
    __cxa_throw(pNVar6,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  default:
    if ((0x3f < uVar1) || ((0xe000000000800000U >> ((ulong)uVar1 & 0x3f) & 1) == 0))
    goto switchD_00199856_caseD_9;
  case 0xd:
  case 0x11:
    attrItemList(this);
    RefCount<AST>::operator=(&local_a8,this_00);
  }
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  local_c0._8_8_ = nullAST;
  if (iVar2 != 0xc) {
    if (iVar2 != 8) {
      pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
      NoViableAltException::NoViableAltException(pNVar6,&local_40);
      __cxa_throw(pNVar6,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if (nullAST.ref == (Ref *)0x0) {
      local_c0._8_8_ = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
    ASTFactory::create((ASTFactory *)local_c0,(RefToken *)nodes);
    RefCount<AST>::operator=((RefCount<AST> *)(local_c0 + 8),(RefCount<AST> *)local_c0);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
    RefCount<Token>::~RefCount(&local_68);
    Parser::match((Parser *)this,8);
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_c0 + 8));
  }
  local_c0._8_8_ = nullAST.ref;
  if (nullAST.ref == (Ref *)0x0) {
    local_c0._8_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)local_c0,(RefToken *)nodes);
  RefCount<AST>::operator=((RefCount<AST> *)(local_c0 + 8),(RefCount<AST> *)local_c0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_78.nodeFactory);
  Parser::match((Parser *)this,0xc);
  RefCount<AST>::operator=(&local_b0,&local_98.root);
  piVar3 = (int *)operator_new(0x20);
  *piVar3 = 0;
  piVar3[2] = 0;
  piVar3[3] = 0;
  piVar3[4] = 0;
  piVar3[5] = 0;
  piVar3[6] = 0;
  piVar3[7] = 0;
  puVar4 = (undefined8 *)operator_new(0x18);
  *(undefined8 **)(piVar3 + 2) = puVar4;
  *(undefined8 **)(piVar3 + 4) = puVar4;
  *(undefined8 **)(piVar3 + 6) = puVar4 + 3;
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  *(undefined8 **)(piVar3 + 4) = puVar4 + 3;
  ASTFactory::create(&local_78,(int)nodes);
  iVar2 = *piVar3;
  *piVar3 = iVar2 + 1;
  RefCount<AST>::operator=
            ((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar3 + 2)),(RefCount<AST> *)&local_78);
  if (local_a0.ref == (Ref *)0x0) {
    local_48.ref = (Ref *)0x0;
  }
  else {
    (local_a0.ref)->count = (local_a0.ref)->count + 1;
    local_48.ref = local_a0.ref;
  }
  iVar2 = *piVar3;
  *piVar3 = iVar2 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar3 + 2)),&local_48);
  if (local_a8.ref == (Ref *)0x0) {
    local_50.ref = (Ref *)0x0;
  }
  else {
    (local_a8.ref)->count = (local_a8.ref)->count + 1;
    local_50.ref = local_a8.ref;
  }
  iVar2 = *piVar3;
  *piVar3 = iVar2 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar3 + 2)),&local_50);
  ASTFactory::make((ASTFactory *)local_c0,(ASTArray *)nodes);
  RefCount<AST>::operator=(&local_b0,(RefCount<AST> *)local_c0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
  RefCount<AST>::~RefCount(&local_50);
  RefCount<AST>::~RefCount(&local_48);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_78);
  RefCount<AST>::operator=(&local_98.root,&local_b0);
  if (local_b0.ref == (Ref *)0x0) {
    pAVar5 = (AST *)0x0;
  }
  else {
    pAVar5 = (local_b0.ref)->ptr;
  }
  if (nullAST.ref == (Ref *)0x0) {
    pAVar7 = (AST *)0x0;
  }
  else {
    pAVar7 = (nullAST.ref)->ptr;
  }
  bVar8 = pAVar5 != pAVar7;
  if (bVar8) {
    AST::getFirstChild((local_b0.ref)->ptr);
    if (local_80.ref == (Ref *)0x0) {
      pAVar5 = (AST *)0x0;
    }
    else {
      pAVar5 = (local_80.ref)->ptr;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar7 = (AST *)0x0;
    }
    else {
      pAVar7 = (nullAST.ref)->ptr;
    }
    if (pAVar5 != pAVar7) {
      bVar8 = true;
      AST::getFirstChild((local_b0.ref)->ptr);
      goto LAB_00199b3a;
    }
  }
  if (local_b0.ref == (Ref *)0x0) {
    local_c0._0_8_ = (Ref *)0x0;
  }
  else {
    (local_b0.ref)->count = (local_b0.ref)->count + 1;
    local_c0._0_8_ = local_b0.ref;
  }
LAB_00199b3a:
  RefCount<AST>::operator=(&local_98.child,(RefCount<AST> *)local_c0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
  if (bVar8) {
    RefCount<AST>::~RefCount(&local_80);
  }
  ASTPair::advanceChildToEnd(&local_98);
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_c0 + 8));
  RefCount<AST>::~RefCount(&local_58);
  RefCount<AST>::operator=(this_00,&local_b0);
  RefCount<AST>::~RefCount(&local_a8);
  RefCount<AST>::~RefCount(&local_a0);
  RefCount<AST>::~RefCount(&local_b0);
  RefCount<AST>::~RefCount(&local_98.child);
  RefCount<AST>::~RefCount(&local_98.root);
  return;
}

Assistant:

void GrpParser::attrItemStruct() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST attrItemStruct_AST = nullAST;
	RefAST I_AST = nullAST;
	RefAST X_AST = nullAST;
	
	try {      // for error handling
		{
		attrName();
		I_AST = returnAST;
		}
		RefAST tmp109_AST = nullAST;
		tmp109_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		case LIT_INT:
		case LITERAL_glyph:
		case LITERAL_justify:
		case LITERAL_min:
		case LITERAL_max:
		{
			attrItemList();
			X_AST = returnAST;
			break;
		}
		case OP_SEMI:
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp110_AST = nullAST;
			tmp110_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp111_AST = nullAST;
		tmp111_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		attrItemStruct_AST = currentAST.root;
		attrItemStruct_AST = astFactory.make( (new ASTArray(3))->add(astFactory.create(ZdotStruct))->add(I_AST)->add(X_AST));
		currentAST.root = attrItemStruct_AST;
		currentAST.child = attrItemStruct_AST!=nullAST &&attrItemStruct_AST->getFirstChild()!=nullAST ?
			attrItemStruct_AST->getFirstChild() : attrItemStruct_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_34);
	}
	returnAST = attrItemStruct_AST;
}